

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O0

bool board::makemove::move(Move *move,Board *pos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int enPas_00;
  int fiftyMove_00;
  int moveValue;
  uint uVar9;
  int *piVar10;
  undefined1 local_68 [8];
  Undo current;
  uint64_t hash;
  int fiftyMove;
  int enPas;
  int castle;
  int piece;
  int side;
  int promoted;
  int captured;
  int to;
  int from;
  Board *pos_local;
  Move *move_local;
  
  iVar2 = Move::getValue(move);
  iVar2 = Move::FROMSQ(iVar2);
  iVar3 = Move::getValue(move);
  iVar3 = Move::TOSQ(iVar3);
  iVar4 = Move::getValue(move);
  iVar4 = Move::CAPTURED(iVar4);
  iVar5 = Move::getValue(move);
  iVar5 = Move::PROMOTED(iVar5);
  iVar6 = Board::getSide(pos);
  iVar7 = Board::getSquare(pos,iVar2);
  iVar8 = Board::getCastlePerm(pos);
  enPas_00 = Board::getEnPas(pos);
  fiftyMove_00 = Board::getFiftyMove(pos);
  current.hashKey = Board::getHashKey(pos);
  moveValue = Move::getValue(move);
  Undo::Undo((Undo *)local_68,iVar8,enPas_00,fiftyMove_00,moveValue,current.hashKey);
  uVar9 = Move::getValue(move);
  if ((uVar9 & 0x40000) == 0) {
    uVar9 = Move::getValue(move);
    if ((uVar9 & 0x1000000) != 0) {
      if (iVar3 == 0x17) {
        movePiece(0x15,0x18,pos);
      }
      else if (iVar3 == 0x5d) {
        movePiece(0x5b,0x5e,pos);
      }
      else if (iVar3 == 0x1b) {
        movePiece(0x1c,0x1a,pos);
      }
      else if (iVar3 == 0x61) {
        movePiece(0x62,0x60,pos);
      }
    }
  }
  else if (iVar6 == 0) {
    clearPiece(iVar3 + -10,pos);
  }
  else {
    clearPiece(iVar3 + 10,pos);
  }
  iVar8 = Board::getEnPas(pos);
  if (iVar8 != 99) {
    Board::hashEnPas(pos);
  }
  Board::hashCastle(pos);
  Board::addHistory(pos,(Undo *)local_68);
  Board::updateCastlePerm(pos,iVar3,iVar2);
  Board::hashCastle(pos);
  Board::clearEnPas(pos);
  Board::incrementFiftyMove(pos);
  if (iVar4 != 0) {
    clearPiece(iVar3,pos);
    Board::resetFiftyMove(pos);
  }
  Board::incrementPly(pos);
  if (Board::PIECE_NO_TEAM[iVar7] == 1) {
    Board::resetFiftyMove(pos);
    uVar9 = Move::getValue(move);
    if ((uVar9 & 0x80000) != 0) {
      if (iVar6 == 0) {
        Board::setEnPas(pos,iVar2 + 10);
      }
      else {
        Board::setEnPas(pos,iVar2 + -10);
      }
      Board::hashEnPas(pos);
    }
  }
  movePiece(iVar2,iVar3,pos);
  if (iVar5 != 0) {
    clearPiece(iVar3,pos);
    addPiece(iVar5,iVar3,pos);
  }
  Board::updateSide(pos);
  Board::hashSide(pos);
  iVar2 = Board::getSide(pos);
  if (iVar2 == 1) {
    piVar10 = Board::getPieceList(pos,6);
    bVar1 = Board::sqAttacked(pos,*piVar10,1);
    if (bVar1) {
      undo(pos);
      return false;
    }
  }
  iVar2 = Board::getSide(pos);
  if (iVar2 == 0) {
    piVar10 = Board::getPieceList(pos,0xc);
    bVar1 = Board::sqAttacked(pos,*piVar10,0);
    if (bVar1) {
      undo(pos);
      return false;
    }
  }
  return true;
}

Assistant:

bool board::makemove::move(Move& move, Board& pos)
{
    int from = Move::FROMSQ(move.getValue());
    int to = Move::TOSQ(move.getValue());
    int captured = Move::CAPTURED(move.getValue());
    int promoted = Move::PROMOTED(move.getValue());
    int side = pos.getSide();
    int piece = pos.getSquare(from);
    int castle = pos.getCastlePerm();
    int enPas = pos.getEnPas();
    int fiftyMove = pos.getFiftyMove();
    uint64_t hash = pos.getHashKey();
    Undo current = Undo(castle, enPas, fiftyMove, move.getValue(), hash);
    if (move.getValue() & Move::MFLAGEP) {
        if (side == WHITE) {
            clearPiece(to - 10, pos);
        }
        else {
            clearPiece(to + 10, pos);
        }
    }
    else if (move.getValue() & Move::MFLAGCA) {
        if (to == C1) {
            movePiece(A1, D1, pos);
        }
        else if (to == C8) {
            movePiece(A8, D8, pos);
        }
        else if (to == G1) {
            movePiece(H1, F1, pos);
        }
        else if (to == G8) {
            movePiece(H8, F8, pos);
        }
    }
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.addHistory(current);
    pos.updateCastlePerm(to, from);
    pos.hashCastle();
    pos.clearEnPas();
    pos.incrementFiftyMove();
    if (captured != EMPTY) {
        clearPiece(to, pos);
        pos.resetFiftyMove();
    }
    pos.incrementPly();
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        pos.resetFiftyMove();
        if (move.getValue() & Move::MFLAGPS) {
            if (side == WHITE) {
                pos.setEnPas(from + 10);
            }
            else {
                pos.setEnPas(from - 10);
            }
            pos.hashEnPas();
        }
    }
    movePiece(from, to, pos);
    if (promoted != EMPTY) {
        clearPiece(to, pos);
        addPiece(promoted, to, pos);
    }
    pos.updateSide();
    pos.hashSide();
    if (pos.getSide() == BLACK && pos.sqAttacked(pos.getPieceList(WK)[0], BLACK)) {
        undo(pos);
        return false;
    }
    if (pos.getSide() == WHITE && pos.sqAttacked(pos.getPieceList(BK)[0], WHITE)) {
        undo(pos);
        return false;
    }
    return true;
}